

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O3

int Aig_NodeMffcLabelCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf0,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7) {
    Aig_ManIncrementTravId(p);
    if (0 < vLeaves->nSize) {
      lVar4 = 0;
      do {
        uVar1 = *(ulong *)((long)vLeaves->pArray[lVar4] + 0x18);
        *(ulong *)((long)vLeaves->pArray[lVar4] + 0x18) =
             uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vLeaves->nSize);
    }
    iVar2 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
    iVar3 = Aig_NodeRefLabel_rec(p,pNode,0);
    if (0 < vLeaves->nSize) {
      lVar4 = 0;
      do {
        uVar1 = *(ulong *)((long)vLeaves->pArray[lVar4] + 0x18);
        *(ulong *)((long)vLeaves->pArray[lVar4] + 0x18) =
             uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 - 0x40U & 0xffffffc0);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vLeaves->nSize);
    }
    if (iVar2 == iVar3) {
      if (0 < iVar2) {
        return iVar2;
      }
      __assert_fail("ConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                    ,0xfa,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf9,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Aig_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                ,0xf1,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

int Aig_NodeMffcLabelCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Aig_Obj_t * pObj;
    int i, ConeSize1, ConeSize2;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs++;
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    ConeSize2 = Aig_NodeRefLabel_rec( p, pNode, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs--;
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}